

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_SetUncatchableError(JSContext *ctx,JSValue val,BOOL flag)

{
  JSValueUnion JVar1;
  JSObject *p;
  BOOL flag_local;
  JSContext *ctx_local;
  JSValue val_local;
  
  JVar1 = val.u;
  if (((int)val.tag == -1) && (*(short *)((long)JVar1.ptr + 6) == 3)) {
    *(byte *)((long)JVar1.ptr + 5) = *(byte *)((long)JVar1.ptr + 5) & 0xdf | ((byte)flag & 1) << 5;
  }
  return;
}

Assistant:

void JS_SetUncatchableError(JSContext *ctx, JSValueConst val, BOOL flag)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return;
    p = JS_VALUE_GET_OBJ(val);
    if (p->class_id == JS_CLASS_ERROR)
        p->is_uncatchable_error = flag;
}